

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar Eigen::internal::
       redux_impl<Eigen::internal::scalar_sum_op<float,float>,Eigen::internal::redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>const,1,-1,true>const,1,-1,true>const>const,Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const>>,3,0>
       ::
       run<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>const,1,_1,true>const,1,_1,true>const>const,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const>>
                 (redux_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>_>
                  *eval,scalar_sum_op<float,_float> *func,
                 CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>
                 *xpr)

{
  long lVar1;
  long index_00;
  long index_01;
  Index index;
  long lVar2;
  CoeffReturnType CVar3;
  CoeffReturnType CVar4;
  float extraout_XMM0_Dc;
  float extraout_XMM0_Dc_00;
  float extraout_XMM0_Dc_01;
  float extraout_XMM0_Dc_02;
  float extraout_XMM0_Dc_03;
  float extraout_XMM0_Dd;
  float extraout_XMM0_Dd_00;
  float extraout_XMM0_Dd_01;
  float extraout_XMM0_Dd_02;
  float extraout_XMM0_Dd_03;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  float afVar9 [4];
  undefined1 local_38 [8];
  float fStack_30;
  float fStack_2c;
  
  lVar1 = (xpr->m_rhs).
          super_BlockImpl<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_Eigen::Dense>.
          super_BlockImpl_dense<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true,_true>.
          super_MapBase<Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>,_0>
          .m_rows.m_value;
  if (lVar1 + 3U < 7) {
    CVar3 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_1,_-1,_true>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
            ::coeff((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
                     *)eval,0);
    for (lVar2 = 1; lVar2 < lVar1; lVar2 = lVar2 + 1) {
      CVar4 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_1,_-1,_true>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
              ::coeff((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
                       *)eval,lVar2);
      CVar3 = CVar3 + CVar4;
    }
  }
  else {
    lVar2 = (lVar1 / 4) * 4;
    afVar9 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>const,1,-1,true>const,1,-1,true>const>const,Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
             ::packet<0,float__vector(4)>
                       ((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>const,1,_1,true>const,1,_1,true>const>const,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                         *)eval,0);
    fVar5 = afVar9[0];
    fVar6 = afVar9[1];
    fStack_30 = extraout_XMM0_Dc;
    fStack_2c = extraout_XMM0_Dd;
    if (7 < lVar1) {
      local_38 = (undefined1  [8])afVar9._0_8_;
      index_00 = (lVar1 / 8) * 8;
      afVar9 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>const,1,-1,true>const,1,-1,true>const>const,Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
               ::packet<0,float__vector(4)>
                         ((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>const,1,_1,true>const,1,_1,true>const>const,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                           *)eval,4);
      fVar5 = afVar9[0];
      fVar6 = afVar9[1];
      fVar7 = extraout_XMM0_Dc_00;
      fVar8 = extraout_XMM0_Dd_00;
      for (index_01 = 0xc; index_01 + -4 < index_00; index_01 = index_01 + 8) {
        afVar9 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>const,1,-1,true>const,1,-1,true>const>const,Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                 ::packet<0,float__vector(4)>
                           ((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>const,1,_1,true>const,1,_1,true>const>const,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                             *)eval,index_01 + -4);
        local_38._4_4_ = (float)local_38._4_4_ + afVar9[1];
        local_38._0_4_ = (float)local_38._0_4_ + afVar9[0];
        fStack_30 = fStack_30 + extraout_XMM0_Dc_01;
        fStack_2c = fStack_2c + extraout_XMM0_Dd_01;
        afVar9 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>const,1,-1,true>const,1,-1,true>const>const,Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                 ::packet<0,float__vector(4)>
                           ((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>const,1,_1,true>const,1,_1,true>const>const,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                             *)eval,index_01);
        fVar5 = fVar5 + afVar9[0];
        fVar6 = fVar6 + afVar9[1];
        fVar7 = fVar7 + extraout_XMM0_Dc_02;
        fVar8 = fVar8 + extraout_XMM0_Dd_02;
      }
      fVar5 = (float)local_38._0_4_ + fVar5;
      fVar6 = (float)local_38._4_4_ + fVar6;
      fStack_30 = fStack_30 + fVar7;
      fStack_2c = fStack_2c + fVar8;
      if (index_00 < lVar2) {
        afVar9 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,-1,-1,0,-1,-1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,-1,1,0,-1,1>const>,1>const,1,-1,true>const,1,-1,true>const>const,Eigen::Block<Eigen::Matrix<float,-1,-1,0,-1,-1>const,-1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                 ::packet<0,float__vector(4)>
                           ((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,float>,Eigen::Transpose<Eigen::Block<Eigen::Block<Eigen::Product<Eigen::Transpose<Eigen::Matrix<float,_1,_1,0,_1,_1>const>,Eigen::DiagonalWrapper<Eigen::Matrix<float,_1,1,0,_1,1>const>,1>const,1,_1,true>const,1,_1,true>const>const,Eigen::Block<Eigen::Matrix<float,_1,_1,0,_1,_1>const,_1,1,true>const>,Eigen::internal::IndexBased,Eigen::internal::IndexBased,float,float>
                             *)eval,index_00);
        fVar5 = fVar5 + afVar9[0];
        fVar6 = fVar6 + afVar9[1];
        fStack_30 = fStack_30 + extraout_XMM0_Dc_03;
        fStack_2c = fStack_2c + extraout_XMM0_Dd_03;
      }
    }
    CVar3 = fStack_2c + fVar6 + fStack_30 + fVar5;
    for (; lVar2 < lVar1; lVar2 = lVar2 + 1) {
      CVar4 = binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,_-1,_1,_0,_-1,_1>_>,_1>,_1,_-1,_true>,_1,_-1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,_-1,_-1,_0,_-1,_-1>,_-1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
              ::coeff((binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_conj_product_op<float,_float>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Block<const_Eigen::Product<Eigen::Transpose<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>_>,_Eigen::DiagonalWrapper<const_Eigen::Matrix<float,__1,_1,_0,__1,_1>_>,_1>,_1,__1,_true>,_1,__1,_true>_>,_const_Eigen::Block<const_Eigen::Matrix<float,__1,__1,_0,__1,__1>,__1,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_float,_float>
                       *)eval,lVar2);
      CVar3 = CVar3 + CVar4;
    }
  }
  return CVar3;
}

Assistant:

static Scalar run(const Evaluator &eval, const Func& func, const XprType& xpr)
  {
    const Index size = xpr.size();
    
    const Index packetSize = redux_traits<Func, Evaluator>::PacketSize;
    const int packetAlignment = unpacket_traits<PacketScalar>::alignment;
    enum {
      alignment0 = (bool(Evaluator::Flags & DirectAccessBit) && bool(packet_traits<Scalar>::AlignedOnScalar)) ? int(packetAlignment) : int(Unaligned),
      alignment = EIGEN_PLAIN_ENUM_MAX(alignment0, Evaluator::Alignment)
    };
    const Index alignedStart = internal::first_default_aligned(xpr);
    const Index alignedSize2 = ((size-alignedStart)/(2*packetSize))*(2*packetSize);
    const Index alignedSize = ((size-alignedStart)/(packetSize))*(packetSize);
    const Index alignedEnd2 = alignedStart + alignedSize2;
    const Index alignedEnd  = alignedStart + alignedSize;
    Scalar res;
    if(alignedSize)
    {
      PacketScalar packet_res0 = eval.template packet<alignment,PacketScalar>(alignedStart);
      if(alignedSize>packetSize) // we have at least two packets to partly unroll the loop
      {
        PacketScalar packet_res1 = eval.template packet<alignment,PacketScalar>(alignedStart+packetSize);
        for(Index index = alignedStart + 2*packetSize; index < alignedEnd2; index += 2*packetSize)
        {
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(index));
          packet_res1 = func.packetOp(packet_res1, eval.template packet<alignment,PacketScalar>(index+packetSize));
        }

        packet_res0 = func.packetOp(packet_res0,packet_res1);
        if(alignedEnd>alignedEnd2)
          packet_res0 = func.packetOp(packet_res0, eval.template packet<alignment,PacketScalar>(alignedEnd2));
      }
      res = func.predux(packet_res0);

      for(Index index = 0; index < alignedStart; ++index)
        res = func(res,eval.coeff(index));

      for(Index index = alignedEnd; index < size; ++index)
        res = func(res,eval.coeff(index));
    }
    else // too small to vectorize anything.
         // since this is dynamic-size hence inefficient anyway for such small sizes, don't try to optimize.
    {
      res = eval.coeff(0);
      for(Index index = 1; index < size; ++index)
        res = func(res,eval.coeff(index));
    }

    return res;
  }